

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O2

void __thiscall
cnn::LookupNode::LookupNode
          (LookupNode *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_ParameterNodeBase).super_Node.dim.nd = 0;
  (this->super_ParameterNodeBase).super_Node.dim.bd = 1;
  (this->super_ParameterNodeBase).super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ParameterNodeBase).super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ParameterNodeBase).super_Node.args.
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ParameterNodeBase).super_Node._vptr_Node = (_func_int **)&PTR__LookupNode_002e7770;
  uVar1 = *(undefined8 *)((p->dim).d + 2);
  uVar2 = *(undefined8 *)((p->dim).d + 4);
  uVar3 = *(undefined8 *)((p->dim).d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)(p->dim).d;
  *(undefined8 *)((this->dim).d + 2) = uVar1;
  *(undefined8 *)((this->dim).d + 4) = uVar2;
  *(undefined8 *)((this->dim).d + 6) = uVar3;
  (this->dim).bd = (p->dim).bd;
  this->index = 0;
  this->pindex = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indices,indices);
  this->pindices = &this->indices;
  this->params = p;
  (this->dim).bd =
       (uint)((ulong)((long)(this->indices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->indices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

LookupNode(LookupParameters* p, const std::vector<unsigned>& indices) : dim(p->dim), index(), pindex(), indices(indices), pindices(&this->indices), params(p) {
    dim.bd = pindices->size();
  }